

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

bool __thiscall
Gudhi::persistence_matrix::
Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
::is_zero_entry(Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
                *this,Index columnIndex,ID_index rowIndex,bool inR)

{
  bool bVar1;
  bool inR_local;
  ID_index rowIndex_local;
  Index columnIndex_local;
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>
  *this_local;
  
  bVar1 = RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
          ::is_zero_entry(&this->matrix_,columnIndex,rowIndex,inR);
  return bVar1;
}

Assistant:

inline bool Matrix<PersistenceMatrixOptions>::is_zero_entry(Index columnIndex, ID_index rowIndex, bool inR) const
{
  // TODO: I don't think there is a particular reason why the indexation is forced, should be removed.
  static_assert(
      isNonBasic && PersistenceMatrixOptions::is_of_boundary_type &&
          (PersistenceMatrixOptions::has_vine_update || PersistenceMatrixOptions::can_retrieve_representative_cycles) &&
          PersistenceMatrixOptions::column_indexation_type != Column_indexation_types::IDENTIFIER,
      "Only enabled for RU matrices.");

  return matrix_.is_zero_entry(columnIndex, rowIndex, inR);
}